

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  ImGuiTableColumn *pIVar4;
  byte bVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiTableSettings *p;
  ImS8 *pIVar8;
  ImGuiTableSettings *pIVar9;
  byte bVar10;
  bool bVar11;
  float fVar12;
  
  table->IsSettingsDirty = false;
  pIVar6 = GImGui;
  if ((table->Flags & 0x20) != 0) {
    return;
  }
  p = TableGetBoundSettings(table);
  if (p == (ImGuiTableSettings *)0x0) {
    p = TableSettingsCreate(table->ID,table->ColumnsCount);
    iVar7 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar6->SettingsTables,p);
    table->SettingsOffset = iVar7;
  }
  iVar7 = table->ColumnsCount;
  p->ColumnsCount = (char)iVar7;
  if (p->ID == table->ID) {
    if (((char)iVar7 == iVar7) && (iVar7 <= p->ColumnsCountMax)) {
      pIVar4 = (table->Columns).Data;
      p->SaveFlags = 0;
      fVar12 = 0.0;
      if (0 < iVar7) {
        pIVar9 = p + 1;
        pIVar8 = &pIVar4->SortDirection;
        iVar7 = 0;
        bVar10 = 0;
        do {
          bVar5 = bVar10;
          fVar1 = *(float *)(pIVar8 + (ulong)((*(ImGuiTableColumnFlags *)(pIVar8 + -0x48) & 4) == 0)
                                      * 8 + -0x38);
          pIVar9->ID = (ImGuiID)fVar1;
          *(char *)&pIVar9->RefScale = (char)iVar7;
          *(ImS8 *)((long)&pIVar9->RefScale + 1) = pIVar8[-5];
          *(ImS8 *)((long)&pIVar9->RefScale + 2) = pIVar8[-1];
          bVar10 = *pIVar8;
          bVar2 = *(byte *)((long)&pIVar9->RefScale + 3);
          *(byte *)((long)&pIVar9->RefScale + 3) = bVar2 & 0xfc | bVar10 & 3;
          bVar10 = bVar2 & 0xf8 | bVar10 & 3 | pIVar8[-10] << 2;
          *(byte *)((long)&pIVar9->RefScale + 3) = bVar10;
          *(byte *)((long)&pIVar9->RefScale + 3) =
               bVar10 & 0xf7 | (byte)*(ImGuiTableColumnFlags *)(pIVar8 + -0x48) * '\x02' & 8;
          uVar3 = *(uint *)(pIVar8 + -0x48);
          bVar11 = (uVar3 & 4) == 0;
          if ((fVar1 != *(float *)(pIVar8 + -0x3c)) ||
             (NAN(fVar1) || NAN(*(float *)(pIVar8 + -0x3c)))) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 1;
          }
          if (iVar7 != pIVar8[-5]) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 2;
          }
          if (pIVar8[-1] != 0xff) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 8;
          }
          if ((uVar3 & 1) == (uint)(byte)pIVar8[-10]) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 4;
          }
          iVar7 = iVar7 + 1;
          pIVar9 = (ImGuiTableSettings *)&pIVar9->ColumnsCount;
          pIVar8 = pIVar8 + 0x68;
          bVar10 = bVar5 | bVar11;
        } while (iVar7 < table->ColumnsCount);
        p->SaveFlags = p->SaveFlags & table->Flags;
        if ((bool)(bVar5 | bVar11)) {
          fVar12 = table->RefScale;
        }
      }
      p->RefScale = fVar12;
      MarkIniSettingsDirty();
      return;
    }
    __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2b95,"void ImGui::TableSaveSettings(ImGuiTable *)");
  }
  __assert_fail("settings->ID == table->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                ,0x2b94,"void ImGui::TableSaveSettings(ImGuiTable *)");
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImS8)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImS8)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsVisible = column->IsVisible;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsVisible != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}